

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

Vec_Int_t * Fra_ClauSaveLatchVars(Aig_Man_t *pMan,Cnf_Dat_t *pCnf,int fCsVars)

{
  int iVar1;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int local_5c;
  int local_3c;
  int i;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo;
  Vec_Int_t *vVars;
  int fCsVars_local;
  Cnf_Dat_t *pCnf_local;
  Aig_Man_t *pMan_local;
  
  iVar1 = Aig_ManRegNum(pMan);
  p = Vec_IntAlloc(iVar1);
  for (local_3c = 0; iVar1 = Aig_ManRegNum(pMan), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar2 = Aig_ManLi(pMan,local_3c);
    pAVar3 = Aig_ManLo(pMan,local_3c);
    if (fCsVars == 0) {
      local_5c = pAVar2->Id;
    }
    else {
      local_5c = pAVar3->Id;
    }
    Vec_IntPush(p,pCnf->pVarNums[local_5c]);
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_ClauSaveLatchVars( Aig_Man_t * pMan, Cnf_Dat_t * pCnf, int fCsVars )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObjLo, * pObjLi;
    int i;
    vVars = Vec_IntAlloc( Aig_ManRegNum(pMan) );
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
        Vec_IntPush( vVars, pCnf->pVarNums[fCsVars? pObjLo->Id : pObjLi->Id] );
    return vVars;
}